

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O3

int uv_thread_getaffinity(uv_thread_t *tid,char *cpumask,size_t mask_size)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_t __cpu;
  ulong uVar4;
  bool bVar5;
  cpu_set_t cpuset;
  cpu_set_t local_a8;
  
  uVar1 = uv_cpumask_size();
  uVar3 = uVar1;
  if (-1 < (int)uVar1) {
    uVar3 = 0xffffffea;
    if (uVar1 <= mask_size) {
      local_a8.__bits[0xe] = 0;
      local_a8.__bits[0xf] = 0;
      local_a8.__bits[0xc] = 0;
      local_a8.__bits[0xd] = 0;
      local_a8.__bits[10] = 0;
      local_a8.__bits[0xb] = 0;
      local_a8.__bits[8] = 0;
      local_a8.__bits[9] = 0;
      local_a8.__bits[6] = 0;
      local_a8.__bits[7] = 0;
      local_a8.__bits[4] = 0;
      local_a8.__bits[5] = 0;
      local_a8.__bits[2] = 0;
      local_a8.__bits[3] = 0;
      local_a8.__bits[0] = 0;
      local_a8.__bits[1] = 0;
      iVar2 = pthread_getaffinity_np(*tid,0x80,&local_a8);
      if (iVar2 == 0) {
        if (uVar1 == 0) {
          uVar3 = 0;
        }
        else {
          uVar4 = 0;
          uVar3 = 0;
          do {
            bVar5 = false;
            if (uVar4 < 0x400) {
              bVar5 = (local_a8.__bits[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0;
            }
            cpumask[uVar4] = bVar5;
            uVar4 = uVar4 + 1;
          } while (uVar1 != uVar4);
        }
      }
      else {
        uVar3 = -iVar2;
      }
    }
  }
  return uVar3;
}

Assistant:

int uv_thread_getaffinity(uv_thread_t* tid,
                          char* cpumask,
                          size_t mask_size) {
  int r;
  int i;
  uv__cpu_set_t cpuset;
  int cpumasksize;

  cpumasksize = uv_cpumask_size();
  if (cpumasksize < 0)
    return cpumasksize;
  if (mask_size < (size_t)cpumasksize)
    return UV_EINVAL;

  CPU_ZERO(&cpuset);
#if defined(__ANDROID__)
  if (sched_getaffinity(pthread_gettid_np(*tid), sizeof(cpuset), &cpuset))
    r = errno;
  else
    r = 0;
#else
  r = pthread_getaffinity_np(*tid, sizeof(cpuset), &cpuset);
#endif
  if (r)
    return UV__ERR(r);
  for (i = 0; i < cpumasksize; i++)
    cpumask[i] = !!CPU_ISSET(i, &cpuset);

  return 0;
}